

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::CountBitsFunction::~CountBitsFunction(CountBitsFunction *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~CountBitsFunction((CountBitsFunction *)0x949b58);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

CountBitsFunction() : SystemSubroutine(KnownSystemName::CountBits, SubroutineKind::Function) {}